

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall
pbrt::SingleLevelFlattener::SingleLevelFlattener(SingleLevelFlattener *this,SP *world)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  pointer psVar3;
  shared_ptr<pbrt::LightSource> lightSource;
  SP local_78;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  undefined1 auStack_50 [16];
  undefined8 uStack_40;
  
  std::__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pbrt::Object>>
            ((__shared_ptr<pbrt::Object,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<pbrt::Object> *)local_68);
  p_Var1 = &(this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->alreadyEmitted)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar3 = ((local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           lightSources).
           super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = ((local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           lightSources).
           super__Vector_base<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar2) {
    do {
      local_68 = (undefined1  [8])
                 (psVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      _Stack_60._M_pi =
           (psVar3->super___shared_ptr<pbrt::LightSource,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_60._M_pi)->_M_use_count = (_Stack_60._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
      ::push_back(&((this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->lightSources,(value_type *)local_68);
      if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar2);
    local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_68 = (undefined1  [8])0x3f800000;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._0_4_ = 1.0;
  local_58._4_4_ = 0.0;
  auStack_50._0_4_ = 0.0;
  auStack_50._4_4_ = 0.0;
  auStack_50._8_4_ = 1.0;
  auStack_50._12_4_ = 0.0;
  uStack_40._0_4_ = 0.0;
  uStack_40._4_4_ = 0.0;
  traverse(this,&local_78,(affine3f *)local_68);
  if (local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>::
  operator=(&((this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             lightSources,
            &((world->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             lightSources);
  return;
}

Assistant:

SingleLevelFlattener(Object::SP world)
      : result(std::make_shared<Object>())
    {
      for (auto lightSource : world->lightSources)
        result->lightSources.push_back(lightSource);
      traverse(world, affine3f::identity());
      result->lightSources = world->lightSources;
    }